

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefer_class_enums.cpp
# Opt level: O3

int main(void)

{
  char local_1c [4];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  local_1c[0] = 'N';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1c,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  local_1c[1] = 0x45;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1c + 1,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  local_1c[2] = 0x57;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1c + 2,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  local_1c[3] = 0x53;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1c + 3,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  return 0;
}

Assistant:

int main() {
  std::cout << "\t" << Direction::NORTH << "\n"
            << "\t" << Direction::EAST  << "\n"
            << "\t" << Direction::WEST  << "\n"
            << "\t" << Direction::SOUTH << "\n";
}